

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrProc.h
# Opt level: O2

void ReadLevelFile(string *path,string *words)

{
  bool bVar1;
  LevelFileReader fileReader;
  string str;
  ifstream file;
  
  std::ifstream::ifstream(&file,(string *)path,_S_in);
  LevelFileReader::LevelFileReader(&fileReader,&file);
  while( true ) {
    LevelFileReader::GetWord_abi_cxx11_(&str,&fileReader);
    bVar1 = std::operator==(&str,anon_var_dwarf_1dbd + 0x12);
    if (bVar1) break;
    std::__cxx11::string::_M_assign((string *)words);
    std::__cxx11::string::~string((string *)&str);
    words = words + 1;
  }
  std::__cxx11::string::~string((string *)&str);
  LevelFileReader::~LevelFileReader(&fileReader);
  std::ifstream::~ifstream(&file);
  return;
}

Assistant:

void ReadLevelFile(const string& path, string* words)
{
    ifstream file(path);
    LevelFileReader fileReader(file);

    for (int i = 0; true; i++)
    {
      string str = fileReader.GetWord();
      if (str == "") break;
      words[i] = str;
    }

    return;
}